

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

cmJSONHelper<std::string> *
cmJSONHelperBuilder::String
          (cmJSONHelper<std::string> *__return_storage_ptr__,ErrorGenerator *error,string *defval)

{
  pointer pcVar1;
  _Any_data _Stack_58;
  code *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function
            ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&_Stack_58,error);
  pcVar1 = (defval->_M_dataplus)._M_p;
  local_38[0] = &local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + defval->_M_string_length);
  std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::String(std::function<void(Json::Value_const*,cmJSONState*)>const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)> *)
             __return_storage_ptr__,(anon_class_64_2_ce0a3bf5 *)&_Stack_58);
  if (local_38[0] != &local_28) {
    operator_delete(local_38[0],local_28._M_allocated_capacity + 1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::string> String(
    const JsonErrors::ErrorGenerator& error = JsonErrors::INVALID_STRING,
    const std::string& defval = "")
  {
    return [error, defval](std::string& out, const Json::Value* value,
                           cmJSONState* state) -> bool {
      if (!value) {
        out = defval;
        return true;
      }
      if (!value->isString()) {
        error(value, state);
        ;
        return false;
      }
      out = value->asString();
      return true;
    };
  }